

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Multi_Label.cxx
# Opt level: O2

void multi_labeltype(Fl_Label *o,int x,int y,int w,int h,Fl_Align a)

{
  int iVar1;
  int H;
  int W;
  char *local_70;
  Fl_Label local;
  
  local_70 = o->value;
  local.image = o->image;
  local.deimage = o->deimage;
  local.font = o->font;
  local.size = o->size;
  local.color = o->color;
  local.align_ = o->align_;
  local.value = *(char **)local_70;
  local.type = local_70[0x10];
  local._41_7_ = SUB87((ulong)*(undefined8 *)&o->type >> 8,0);
  H = h;
  W = w;
  Fl_Label::measure(&local,&W,&H);
  Fl_Label::draw(&local,x,y,w,h,a);
  if ((a & 2) != 0) {
    h = h - H;
    goto LAB_001bea08;
  }
  iVar1 = H;
  if ((a & 1) == 0) {
    if ((a & 8) != 0) {
      w = w - W;
      goto LAB_001bea08;
    }
    if ((a & 4) != 0) {
      x = x + W;
      w = w - W;
      goto LAB_001bea08;
    }
    iVar1 = (H + h) / 2;
  }
  y = y + iVar1;
  h = h - iVar1;
LAB_001bea08:
  local.value = *(char **)(local_70 + 8);
  local.type = local_70[0x11];
  Fl_Label::draw(&local,x,y,w,h,a);
  return;
}

Assistant:

static void multi_labeltype(
    const Fl_Label* o, int x, int y, int w, int h, Fl_Align a)
{
  Fl_Multi_Label* b = (Fl_Multi_Label*)(o->value);
  Fl_Label local = *o;
  local.value = b->labela;
  local.type = b->typea;
  int W = w; int H = h; local.measure(W, H);
  local.draw(x,y,w,h,a);
  if (a & FL_ALIGN_BOTTOM) h -= H;
  else if (a & FL_ALIGN_TOP) {y += H; h -= H;}
  else if (a & FL_ALIGN_RIGHT) w -= W;
  else if (a & FL_ALIGN_LEFT) {x += W; w -= W;}
  else {int d = (h+H)/2; y += d; h -= d;}
  local.value = b->labelb;
  local.type = b->typeb;
  local.draw(x,y,w,h,a);
}